

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

void anon_unknown.dwarf_113f::mndl<Imf_3_4::Rgba>
               (Array2D<Imf_3_4::Rgba> *px,int w,int h,int xMin,int xMax,int yMin,int yMax,
               int xSamples,int ySamples,double rMin,double rMax,double iMin,double aspect,
               double rSeed,double iSeed)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_3_4::Rgba> *in_RDI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  int k;
  double s;
  double i_1;
  double r;
  int kMax;
  double sMax;
  double b;
  double a;
  int j;
  int i;
  Rgba *p;
  int x;
  int y;
  float t;
  double ty;
  double tx;
  double sy;
  double sx;
  double iMax;
  uint in_stack_ffffffffffffff28;
  uint uVar1;
  int in_stack_ffffffffffffff2c;
  double in_stack_ffffffffffffff30;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_84;
  undefined4 local_80;
  
  if (6 < i_1._0_4_) {
    i_1._0_4_ = 6;
  }
  if (6 < r._0_4_) {
    r._0_4_ = 6;
  }
  for (local_80 = in_R9D; local_84 = in_ECX, local_80 < s._0_4_; local_80 = local_80 + 1) {
    for (; local_84 < in_R8D; local_84 = local_84 + 1) {
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](in_RDI,(long)(local_80 - in_R9D));
      clear((Rgba *)0x10af6d);
      for (local_94 = 0; local_94 < i_1._0_4_; local_94 = local_94 + 1) {
        for (local_98 = 0; local_98 < r._0_4_; local_98 = local_98 + 1) {
          in_stack_ffffffffffffff30 = 0.0;
          in_stack_ffffffffffffff2c = 0;
          uVar1 = in_stack_ffffffffffffff28;
          local_c8 = in_XMM5_Qa;
          local_c0 = in_XMM4_Qa;
          while( true ) {
            in_stack_ffffffffffffff28 = uVar1 & 0xffffff;
            if (in_stack_ffffffffffffff2c < 0x100) {
              in_stack_ffffffffffffff28 = CONCAT13(in_stack_ffffffffffffff30 < 100.0,(int3)uVar1);
            }
            if ((char)(in_stack_ffffffffffffff28 >> 0x18) == '\0') break;
            in_stack_ffffffffffffff30 = local_c0 * local_c0 + -(local_c8 * local_c8);
            local_c8 = local_c0 * 2.0 * local_c8 +
                       (((in_XMM2_Qa +
                         (in_XMM3_Qa * (in_XMM1_Qa - in_XMM0_Qa) * (double)in_EDX) / (double)in_ESI)
                        - in_XMM2_Qa) / (double)in_EDX) *
                       ((double)local_98 * (double)(1.0 / (float)r._0_4_) + (double)local_80) +
                       in_XMM2_Qa;
            local_c0 = in_stack_ffffffffffffff30 +
                       ((in_XMM1_Qa - in_XMM0_Qa) / (double)in_ESI) *
                       ((double)local_94 * (double)(1.0 / (float)i_1._0_4_) + (double)local_84) +
                       in_XMM0_Qa;
            in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c + 1;
            uVar1 = in_stack_ffffffffffffff28;
          }
          add((float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
              (Rgba *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
      }
      scale((float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
            (Rgba *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
  }
  return;
}

Assistant:

void
mndl (
    Array2D<P>& px,
    int         w,
    int         h,
    int         xMin,
    int         xMax,
    int         yMin,
    int         yMax,
    int         xSamples,
    int         ySamples,
    double      rMin,
    double      rMax,
    double      iMin,
    double      aspect,
    double      rSeed,
    double      iSeed)
{
    if (xSamples > 6) xSamples = 6;

    if (ySamples > 6) ySamples = 6;

    double iMax = iMin + aspect * (rMax - rMin) * h / w;
    double sx   = double (rMax - rMin) / w;
    double sy   = double (iMax - iMin) / h;
    double tx   = 1.f / xSamples;
    double ty   = 1.f / ySamples;
    float  t    = tx * ty;

    for (int y = yMin; y < yMax; ++y)
    {
        for (int x = xMin; x < xMax; ++x)
        {
            P& p = px[y - yMin][x - xMin];

            clear (p);

            for (int i = 0; i < xSamples; ++i)
            {
                for (int j = 0; j < ySamples; ++j)
                {
                    const double a    = rMin + sx * (x + i * tx);
                    const double b    = iMin + sy * (y + j * ty);
                    const double sMax = 100;
                    const int    kMax = 256;
                    double       r    = rSeed;
                    double       i    = iSeed;
                    double       s    = 0;
                    int          k    = 0;

                    while (k < kMax && s < sMax)
                    {
                        s = r * r - i * i;
                        i = 2 * r * i + b;
                        r = s + a;
                        k++;
                    }

                    add (k / float (kMax), p);
                }
            }

            scale (t, p);
        }
    }
}